

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel_sse.c
# Opt level: O2

void uavs3d_conv_fmt_8bit_sse
               (uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
               int src_stridec,int *dst_stride,int uv_shift)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  long lVar6;
  long lVar7;
  uchar *puVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  
  puVar8 = *dst;
  puVar3 = dst[1];
  puVar4 = dst[2];
  iVar9 = 0;
  if (0 < height) {
    iVar9 = height;
  }
  while (auVar2 = _DAT_00188710, bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
    memcpy(puVar8,src_y,(long)width);
    src_y = src_y + src_stride;
    puVar8 = puVar8 + *dst_stride;
  }
  iVar10 = height >> ((byte)uv_shift & 0x1f);
  uVar1 = (width >> ((byte)uv_shift & 0x1f)) * 2;
  iVar9 = 0;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  puVar8 = src_uv + 1;
  for (; iVar9 != iVar10; iVar9 = iVar9 + 1) {
    lVar6 = 0;
    puVar5 = puVar8;
    for (lVar7 = 0; lVar7 < (int)(uVar1 & 0xfffffff0); lVar7 = lVar7 + 0x10) {
      auVar12 = pshufb(*(undefined1 (*) [16])(src_uv + lVar7),auVar2);
      *(long *)(puVar3 + lVar6) = auVar12._0_8_;
      *(long *)(puVar4 + lVar6) = auVar12._8_8_;
      lVar6 = lVar6 + 8;
      puVar5 = puVar5 + 0x10;
    }
    for (; lVar7 < (int)uVar1; lVar7 = lVar7 + 2) {
      puVar3[lVar6] = puVar5[-1];
      puVar4[lVar6] = *puVar5;
      puVar5 = puVar5 + 2;
      lVar6 = lVar6 + 1;
    }
    src_uv = src_uv + src_stridec;
    puVar3 = puVar3 + dst_stride[1];
    puVar4 = puVar4 + dst_stride[2];
    puVar8 = puVar8 + src_stridec;
  }
  return;
}

Assistant:

void uavs3d_conv_fmt_8bit_sse(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift)
{
    __m128i uv_mask = _mm_set1_epi16(0xff), msrc, msrcu, msrcv;
    unsigned char* p_src = src_y;
    unsigned char* p_dst_y = dst[0];
    unsigned char* p_dst_u = dst[1];
    unsigned char* p_dst_v = dst[2];
    int i, j, j2;
    int width16;
    for (i = 0; i < height; i++) {
        memcpy(p_dst_y, p_src, width);
        p_src += src_stride;
        p_dst_y += dst_stride[0];
    }
    width >>= uv_shift;
    height >>= uv_shift;

    p_src = src_uv;
    width <<= 1;
    width16 = (width >> 4) << 4;
    for (i = 0; i < height; i++) {
        for (j = 0; j < width16; j += 16) {
            j2 = j >> 1;
            msrc = _mm_loadu_si128((const __m128i*)(p_src + j));
            msrcu = _mm_and_si128(msrc, uv_mask);
            msrcv = _mm_and_si128(_mm_srli_si128(msrc, 1), uv_mask);
            msrc = _mm_packus_epi16(msrcu, msrcv);
            _mm_storel_epi64((__m128i*)(p_dst_u + j2), msrc);
            _mm_storel_epi64((__m128i*)(p_dst_v + j2), _mm_srli_si128(msrc, 8));
        }
        for (; j < width; j += 2) {
            p_dst_u[j >> 1] = p_src[j];
            p_dst_v[j >> 1] = p_src[j + 1];
        }
        p_src += src_stridec;
        p_dst_u += dst_stride[1];
        p_dst_v += dst_stride[2];
    }
}